

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.h
# Opt level: O3

void __thiscall
HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::HashtableTest(HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *this)

{
  SetKey local_3a;
  SelectKey local_39;
  Hasher local_38;
  Hasher local_2c;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_20;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__HashtableTest_00c15cd8;
  local_2c.id_ = 0;
  local_2c.num_hashes_ = 0;
  local_2c.num_compares_ = 0;
  local_38.id_ = 0;
  local_38.num_hashes_ = 0;
  local_38.num_compares_ = 0;
  local_20.id_ = 0;
  local_20.count_ = (int *)0x0;
  (this->ht_).
  super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c15d98;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&(this->ht_).
                      super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      .ht_.rep,0,&local_2c,&local_38,&local_39,&local_3a,&local_20);
  (this->ht_).
  super_BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c15d18;
  return;
}

Assistant:

HashtableTest() : ht_() {}